

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O2

UInt32 CountDefinedBits(Byte *bits,UInt32 numItems)

{
  UInt32 UVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  
  bVar2 = 0;
  uVar3 = 0;
  UVar1 = 0;
  while( true ) {
    bVar4 = numItems == 0;
    numItems = numItems - 1;
    if (bVar4) break;
    if (uVar3 == 0) {
      bVar2 = *bits;
      bits = bits + 1;
      uVar3 = 8;
    }
    uVar3 = uVar3 - 1;
    UVar1 = UVar1 + ((bVar2 >> (uVar3 & 0x1f) & 1) != 0);
  }
  return UVar1;
}

Assistant:

static UInt32 CountDefinedBits(const Byte *bits, UInt32 numItems)
{
  Byte b = 0;
  unsigned m = 0;
  UInt32 sum = 0;
  for (; numItems != 0; numItems--)
  {
    if (m == 0)
    {
      b = *bits++;
      m = 8;
    }
    m--;
    sum += ((b >> m) & 1);
  }
  return sum;
}